

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OddImageSizes.c
# Opt level: O3

void draw(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,IceTFloat *background_color,
         IceTInt *readback_viewport,IceTImage result)

{
  IceTFloat *pIVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined6 uVar12;
  undefined8 uVar13;
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  short sVar17;
  undefined4 uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  double dVar23;
  byte bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  IceTBoolean IVar28;
  ulong uVar29;
  long lVar30;
  double *pdVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  IceTInt IVar36;
  int iVar37;
  IceTInt IVar38;
  IceTFloat IVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  char cVar47;
  undefined1 uVar48;
  char cVar49;
  char cVar50;
  IceTFloat IVar51;
  IceTFloat IVar52;
  float fVar53;
  IceTFloat IVar54;
  double dVar55;
  IceTFloat IVar56;
  IceTInt screen_height;
  IceTInt screen_width;
  hexahedron transformed_box;
  IceTDouble inverse_transpose_transform [16];
  IceTDouble transform [16];
  int local_300;
  int local_2fc;
  IceTFloat *local_2f8;
  IceTFloat *local_2f0;
  IceTUByte *local_2e8;
  IceTFloat *local_2e0;
  double local_2d8;
  double local_2d0;
  undefined1 local_2c8 [16];
  double local_2b8 [24];
  IceTDouble local_1f8 [16];
  double local_178 [24];
  IceTDouble local_b8 [17];
  char cVar3;
  char cVar4;
  char cVar5;
  
  local_2e0 = background_color;
  icetMatrixMultiply(local_b8,projection_matrix,modelview_matrix);
  IVar28 = icetMatrixInverseTranspose(local_b8,local_1f8);
  if (IVar28 == '\0') {
    puts("ERROR: Inverse failed.");
  }
  lVar34 = 0;
  do {
    icetMatrixVectorMultiply
              ((IceTDouble *)((long)local_2b8 + lVar34),local_1f8,
               (IceTDouble *)((long)unit_box.planes[0] + lVar34));
    lVar34 = lVar34 + 0x20;
  } while (lVar34 != 0xc0);
  icetGetIntegerv(7,&local_2fc);
  icetGetIntegerv(8,&local_300);
  if (g_transparent == 1) {
    local_2f8 = icetImageGetColorf(result);
    local_2f0 = (IceTFloat *)0x0;
    local_2e8 = (IceTUByte *)0x0;
  }
  else {
    local_2e8 = icetImageGetColorub(result);
    local_2f0 = icetImageGetDepthf(result);
    local_2f8 = (IceTFloat *)0x0;
  }
  fVar27 = g_color[2];
  fVar26 = g_color[1];
  fVar25 = g_color[0];
  bVar24 = g_transparent;
  iVar33 = readback_viewport[3];
  if (0 < iVar33) {
    IVar36 = *readback_viewport;
    iVar37 = readback_viewport[1];
    local_2c8 = ZEXT416((uint)g_color[3]);
    IVar38 = readback_viewport[2];
    iVar35 = iVar37;
    do {
      if (0 < IVar38) {
        lVar34 = (long)IVar36;
        local_2d8 = ((double)iVar35 + (double)iVar35) / (double)local_300 + -1.0;
        do {
          iVar33 = local_2fc;
          iVar37 = (int)lVar34;
          local_2d0 = ((double)iVar37 + (double)iVar37) / (double)local_2fc + -1.0;
          uVar40 = SUB81(local_2d0,0);
          uVar41 = (undefined1)((ulong)local_2d0 >> 8);
          uVar42 = (undefined1)((ulong)local_2d0 >> 0x10);
          uVar43 = (undefined1)((ulong)local_2d0 >> 0x18);
          uVar44 = (undefined1)((ulong)local_2d0 >> 0x20);
          uVar45 = (undefined1)((ulong)local_2d0 >> 0x28);
          uVar46 = (undefined1)((ulong)local_2d0 >> 0x30);
          uVar48 = (undefined1)((ulong)local_2d0 >> 0x38);
          memcpy(local_178,local_2b8,0xc0);
          uVar29 = CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(uVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40))))))) ^
                   CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(uVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40)))))));
          uVar40 = (undefined1)uVar29;
          uVar41 = (undefined1)(uVar29 >> 8);
          uVar42 = (undefined1)(uVar29 >> 0x10);
          uVar43 = (undefined1)(uVar29 >> 0x18);
          uVar44 = (undefined1)(uVar29 >> 0x20);
          uVar45 = (undefined1)(uVar29 >> 0x28);
          uVar46 = (undefined1)(uVar29 >> 0x30);
          uVar48 = (undefined1)(uVar29 >> 0x38);
          uVar29 = 0xffffffff;
          pdVar31 = local_178 + 3;
          dVar10 = 2.0;
          uVar32 = 0;
          do {
            dVar23 = ((pdVar31[-3] * local_2d0 + local_2d8 * pdVar31[-2]) - pdVar31[-1]) + *pdVar31;
            dVar55 = pdVar31[-3] * 0.0 + pdVar31[-2] * 0.0 + pdVar31[-1];
            if ((dVar55 != 0.0) || (NAN(dVar55))) {
              dVar23 = (double)((ulong)dVar23 ^ (ulong)DAT_0011c8a0) / dVar55;
              if (dVar55 < 0.0) {
                if ((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13
                                                  (uVar43,CONCAT12(uVar42,CONCAT11(uVar41,uVar40))))
                                                  ))) <= dVar23 &&
                    dVar23 != (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(
                                                  uVar44,CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(
                                                  uVar41,uVar40)))))))) {
                  uVar29 = uVar32 & 0xffffffff;
                  uVar40 = SUB81(dVar23,0);
                  uVar41 = (undefined1)((ulong)dVar23 >> 8);
                  uVar42 = (undefined1)((ulong)dVar23 >> 0x10);
                  uVar43 = (undefined1)((ulong)dVar23 >> 0x18);
                  uVar44 = (undefined1)((ulong)dVar23 >> 0x20);
                  uVar45 = (undefined1)((ulong)dVar23 >> 0x28);
                  uVar46 = (undefined1)((ulong)dVar23 >> 0x30);
                  uVar48 = (undefined1)((ulong)dVar23 >> 0x38);
                }
              }
              else if (dVar23 < dVar10) {
                dVar10 = dVar23;
              }
            }
            else if (0.0 < dVar23) goto LAB_001089a1;
            uVar32 = uVar32 + 1;
            pdVar31 = pdVar31 + 4;
          } while (uVar32 != 6);
          if ((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(
                                                  uVar43,CONCAT12(uVar42,CONCAT11(uVar41,uVar40)))))
                                              )) <= dVar10 &&
              dVar10 != (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,
                                                  CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(uVar41,
                                                  uVar40)))))))) {
            lVar30 = (long)(int)uVar29;
            dVar23 = local_2b8[lVar30 * 4 + 2];
            fVar53 = (float)((double)((ulong)dVar23 ^ (ulong)DAT_0011c8a0) /
                            SQRT(dVar23 * dVar23 +
                                 local_2b8[lVar30 * 4] * local_2b8[lVar30 * 4] +
                                 local_2b8[lVar30 * 4 + 1] * local_2b8[lVar30 * 4 + 1]));
            IVar51 = (IceTFloat)(fVar25 * fVar53);
            IVar56 = (IceTFloat)(fVar26 * fVar53);
            IVar54 = (IceTFloat)(fVar53 * fVar27);
            if ((bVar24 & 1) == 0) {
              IVar39 = (IceTFloat)
                       (float)((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(
                                                  uVar44,CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(
                                                  uVar41,uVar40))))))) * 0.5);
              IVar52 = (IceTFloat)local_2c8._0_4_;
              goto LAB_00108a96;
            }
            dVar10 = (dVar10 - (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(
                                                  uVar44,CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(
                                                  uVar41,uVar40)))))))) * 4.0;
            lVar30 = (long)(int)(dVar10 * 1024.0);
            if (4.0 <= dVar10) {
              lVar30 = 0x1000;
            }
            fVar53 = (float)(double)g_opacity_lookup[lVar30];
            IVar51 = (IceTFloat)((float)IVar51 * fVar53);
            IVar56 = (IceTFloat)((float)IVar56 * fVar53);
            IVar54 = (IceTFloat)((float)IVar54 * fVar53);
            IVar52 = (IceTFloat)((float)local_2c8._0_4_ * fVar53);
LAB_00108a78:
            pIVar1 = local_2f8 + (iVar33 * iVar35 + iVar37) * 4;
            *pIVar1 = IVar51;
            pIVar1[1] = IVar56;
            pIVar1[2] = IVar54;
            pIVar1[3] = IVar52;
          }
          else {
LAB_001089a1:
            IVar51 = *local_2e0;
            IVar56 = local_2e0[1];
            IVar54 = local_2e0[2];
            IVar52 = local_2e0[3];
            IVar39 = 1.0;
            if ((bVar24 & 1) != 0) goto LAB_00108a78;
LAB_00108a96:
            iVar33 = iVar33 * iVar35;
            iVar19 = (int)((float)IVar51 * 255.0);
            iVar20 = (int)((float)IVar56 * 255.0);
            cVar47 = (char)((uint)iVar20 >> 0x10);
            iVar21 = (int)((float)IVar54 * 255.0);
            cVar49 = (char)((uint)iVar21 >> 0x10);
            iVar22 = (int)((float)IVar52 * 255.0);
            cVar50 = (char)((uint)iVar22 >> 0x10);
            uVar12 = CONCAT15((char)((uint)iVar20 >> 8),CONCAT14((char)iVar20,iVar19));
            uVar13 = CONCAT17((char)((uint)iVar20 >> 0x18),CONCAT16(cVar47,uVar12));
            Var14 = CONCAT19((char)((uint)iVar21 >> 8),CONCAT18((char)iVar21,uVar13));
            auVar15[10] = cVar49;
            auVar15._0_10_ = Var14;
            auVar15[0xb] = (char)((uint)iVar21 >> 0x18);
            auVar16[0xc] = (char)iVar22;
            auVar16._0_12_ = auVar15;
            auVar16[0xd] = (char)((uint)iVar22 >> 8);
            auVar11[0xe] = cVar50;
            auVar11._0_14_ = auVar16;
            auVar11[0xf] = (char)((uint)iVar22 >> 0x18);
            sVar6 = (short)iVar19;
            cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar19 - (0xff < sVar6);
            sVar6 = (short)((uint)iVar19 >> 0x10);
            sVar7 = (short)((uint6)uVar12 >> 0x20);
            cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar20 - (0xff < sVar7);
            sVar7 = (short)((ulong)uVar13 >> 0x30);
            sVar8 = (short)((unkuint10)Var14 >> 0x40);
            cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar21 - (0xff < sVar8);
            sVar8 = auVar15._10_2_;
            sVar9 = auVar16._12_2_;
            cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar22 - (0xff < sVar9);
            sVar9 = auVar11._14_2_;
            sVar17 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                              (0xff < sVar6),cVar2);
            uVar18 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar47 - (0xff < sVar7),
                              CONCAT12(cVar3,sVar17));
            uVar12 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * cVar49 - (0xff < sVar8),
                              CONCAT14(cVar4,uVar18));
            sVar6 = (short)((uint)uVar18 >> 0x10);
            sVar7 = (short)((uint6)uVar12 >> 0x20);
            sVar8 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar50 - (0xff < sVar9),
                                     CONCAT16(cVar5,uVar12)) >> 0x30);
            *(uint *)(local_2e8 + (long)(iVar33 + iVar37) * 4) =
                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                            (0 < sVar17) * (sVar17 < 0x100) * cVar2 -
                                            (0xff < sVar17))));
            local_2f0[iVar33 + lVar34] = IVar39;
            IVar36 = *readback_viewport;
            IVar38 = readback_viewport[2];
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 < IVar38 + IVar36);
        iVar37 = readback_viewport[1];
        iVar33 = readback_viewport[3];
      }
      iVar35 = iVar35 + 1;
    } while (iVar35 < iVar33 + iVar37);
  }
  if (g_first_render == '\x01') {
    if (g_sync_render == '\x01') {
      icetCommBarrier();
    }
    g_first_render = '\0';
  }
  return;
}

Assistant:

static void draw(const IceTDouble *projection_matrix,
                 const IceTDouble *modelview_matrix,
                 const IceTFloat *background_color,
                 const IceTInt *readback_viewport,
                 IceTImage result)
{
    IceTUByte *color_buffer;
    IceTFloat *depth_buffer;
    IceTSizeType num_pixels;
    IceTSizeType i;

    /* Suppress compiler warnings. */
    (void)projection_matrix;
    (void)modelview_matrix;
    (void)background_color;
    (void)readback_viewport;

    num_pixels = icetImageGetNumPixels(result);

    color_buffer = icetImageGetColorub(result);
    for (i = 0; i < num_pixels*4; i++) {
        color_buffer[i] = 255;
    }

    depth_buffer = icetImageGetDepthf(result);
    for (i = 0; i < num_pixels; i++) {
        depth_buffer[i] = 0.5f;
    }
}